

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

If_LibBox_t * If_LibBoxRead(char *pFileName)

{
  int Id_00;
  int iVar1;
  int nPis_00;
  int nPos_00;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  If_Box_t *pBox_00;
  int local_58;
  int nPos;
  int nPis;
  int fBlack;
  int Id;
  int i;
  char *pName;
  char *pToken;
  If_Box_t *pBox;
  If_LibBox_t *p;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pName = If_LibBoxGetToken((FILE *)__stream);
    if (pName == (char *)0x0) {
      fclose(__stream);
      printf("Cannot read library name from file \"%s\".\n",pFileName);
      pFileName_local = (char *)0x0;
    }
    else if (*pName == '.') {
      fclose(__stream);
      printf("Wrong box format. Please try \"read_box -e\".\n");
      pFileName_local = (char *)0x0;
    }
    else {
      pFileName_local = (char *)If_LibBoxStart();
      while (pName != (char *)0x0) {
        pcVar2 = Abc_UtilStrsav(pName);
        pcVar3 = If_LibBoxGetToken((FILE *)__stream);
        Id_00 = atoi(pcVar3);
        pcVar3 = If_LibBoxGetToken((FILE *)__stream);
        iVar1 = atoi(pcVar3);
        pcVar3 = If_LibBoxGetToken((FILE *)__stream);
        nPis_00 = atoi(pcVar3);
        pcVar3 = If_LibBoxGetToken((FILE *)__stream);
        nPos_00 = atoi(pcVar3);
        pBox_00 = If_BoxStart(pcVar2,Id_00,nPis_00,nPos_00,0,(uint)((iVar1 != 0 ^ 0xffU) & 1),0);
        If_LibBoxAdd((If_LibBox_t *)pFileName_local,pBox_00);
        for (fBlack = 0; fBlack < nPis_00 * nPos_00; fBlack = fBlack + 1) {
          pcVar2 = If_LibBoxGetToken((FILE *)__stream);
          if (*pcVar2 == '-') {
            local_58 = -1000000000;
          }
          else {
            local_58 = atoi(pcVar2);
          }
          pBox_00->pDelays[fBlack] = local_58;
        }
        pName = If_LibBoxGetToken((FILE *)__stream);
      }
      fclose(__stream);
    }
  }
  return (If_LibBox_t *)pFileName_local;
}

Assistant:

If_LibBox_t * If_LibBoxRead( char * pFileName )
{
    FILE * pFile;
    If_LibBox_t * p;
    If_Box_t * pBox;
    char * pToken, * pName;
    int i, Id, fBlack, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // get the library name
    pToken = If_LibBoxGetToken( pFile );
    if ( pToken == NULL )
    {
        fclose( pFile );
        printf( "Cannot read library name from file \"%s\".\n", pFileName );
        return NULL;
    }
    if ( pToken[0] == '.' )    
    {
        fclose( pFile );
        printf( "Wrong box format. Please try \"read_box -e\".\n" );
        return NULL;
    }
       
    // create library
    p = If_LibBoxStart();
    while ( pToken )
    {
        // save name
        pName  = Abc_UtilStrsav(pToken);
        // save ID
        pToken = If_LibBoxGetToken( pFile );
        Id     = atoi( pToken );
        // save white/black
        pToken = If_LibBoxGetToken( pFile );
        fBlack = !atoi( pToken );
        // save PIs
        pToken = If_LibBoxGetToken( pFile );
        nPis   = atoi( pToken );
        // save POs
        pToken = If_LibBoxGetToken( pFile );
        nPos   = atoi( pToken );
        // create box
        pBox   = If_BoxStart( pName, Id, nPis, nPos, 0, fBlack, 0 );
        If_LibBoxAdd( p, pBox );
        // read the table
        for ( i = 0; i < nPis * nPos; i++ )
        {
            pToken = If_LibBoxGetToken( pFile );
            pBox->pDelays[i] = (pToken[0] == '-') ? -ABC_INFINITY : atoi(pToken);
        }
        // extract next name
        pToken = If_LibBoxGetToken( pFile );
    }
    fclose( pFile );
    return p;
}